

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int IoCommandReadFins(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int *__ptr;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *pVVar2;
  char *pcVar3;
  uint fVerbose;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    if (pNtk != (Abc_Ntk_t *)0x0) {
      pcVar3 = argv[globalUtilOptind];
      if (pNtk->vFins != (Vec_Int_t *)0x0) {
        __ptr = pNtk->vFins->pArray;
        if (__ptr != (int *)0x0) {
          free(__ptr);
          pNtk->vFins->pArray = (int *)0x0;
        }
        if (pNtk->vFins != (Vec_Int_t *)0x0) {
          free(pNtk->vFins);
          pNtk->vFins = (Vec_Int_t *)0x0;
        }
      }
      pVVar2 = Io_ReadFins(pNtk,pcVar3,fVerbose);
      pNtk->vFins = pVVar2;
      return 0;
    }
    Abc_Print(-1,"Empty network.\n");
  }
  else {
    fwrite("usage: read_fins [-vh] <file>\n",0x1e,1,(FILE *)pAbc->Err);
    fwrite("\t         reads the network in equation format\n",0x2f,1,(FILE *)pAbc->Err);
    pcVar3 = "yes";
    if (fVerbose == 0) {
      pcVar3 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-v     : enable verbose output [default = %s].\n",pcVar3);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  }
  return 1;
}

Assistant:

int IoCommandReadFins( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Io_ReadFins( Abc_Ntk_t * pNtk, char * pFileName, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    char * pFileName;
    int c, fVerbose = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // check current network
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // compute information and save it in the network
    Vec_IntFreeP( &pNtk->vFins );
    pNtk->vFins = Io_ReadFins( pNtk, pFileName, fVerbose );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_fins [-vh] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in equation format\n" );
    fprintf( pAbc->Err, "\t-v     : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}